

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

void __thiscall toml::bad_result_access::~bad_result_access(bad_result_access *this)

{
  bad_result_access *in_RDI;
  
  ~bad_result_access(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

~bad_result_access() noexcept override = default;